

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int tcptran_listener_init(void *arg,nng_url *url,nni_listener *nlistener)

{
  char cVar1;
  int iVar2;
  nni_sock *sock;
  
  sock = nni_listener_sock(nlistener);
  *(nni_listener **)((long)arg + 0x420) = nlistener;
  tcptran_ep_init((tcptran_ep *)arg,sock,tcptran_accept_cb);
  cVar1 = *url->u_path;
  iVar2 = 0xf;
  if ((((cVar1 == '\0') || ((cVar1 == '/' && (url->u_path[1] == '\0')))) &&
      (url->u_fragment == (char *)0x0)) &&
     ((url->u_userinfo == (char *)0x0 && (url->u_query == (char *)0x0)))) {
    iVar2 = nng_stream_listener_alloc_url((nng_stream_listener **)((long)arg + 0x418),url);
    if (iVar2 == 0) {
      nni_listener_add_stat(nlistener,(nni_stat_item *)((long)arg + 0x430));
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
tcptran_listener_init(void *arg, nng_url *url, nni_listener *nlistener)
{
	tcptran_ep *ep = arg;
	int         rv;
	nni_sock   *sock = nni_listener_sock(nlistener);

	ep->nlistener = nlistener;
	tcptran_ep_init(ep, sock, tcptran_accept_cb);

	// Check for invalid URL components.
	if ((strlen(url->u_path) != 0) && (strcmp(url->u_path, "/") != 0)) {
		return (NNG_EADDRINVAL);
	}
	if ((url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL)) {
		return (NNG_EADDRINVAL);
	}

	if ((rv = nng_stream_listener_alloc_url(&ep->listener, url)) != 0) {
		return (rv);
	}
#ifdef NNG_ENABLE_STATS
	nni_listener_add_stat(nlistener, &ep->st_rcv_max);
#endif

	return (0);
}